

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

void Dau_DecMoveFreeToLSB(word *p,int nVars,int *V2P,int *P2V,int maskB,int sizeB)

{
  uint v;
  int p_00;
  
  if (nVars < 1) {
    p_00 = 0;
  }
  else {
    p_00 = 0;
    v = 0;
    do {
      if (((uint)maskB >> (v & 0x1f) & 1) == 0) {
        Abc_TtMoveVar(p,nVars,V2P,P2V,v,p_00);
        p_00 = p_00 + 1;
      }
      v = v + 1;
    } while (nVars != v);
  }
  if (p_00 != nVars - sizeB) {
    __assert_fail("c == nVars - sizeB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x1cc,"void Dau_DecMoveFreeToLSB(word *, int, int *, int *, int, int)");
  }
  return;
}

Assistant:

void Dau_DecMoveFreeToLSB( word * p, int nVars, int * V2P, int * P2V, int maskB, int sizeB )
{
    int v, c = 0;
    for ( v = 0; v < nVars; v++ )
        if ( !((maskB >> v) & 1) )
            Abc_TtMoveVar( p, nVars, V2P, P2V, v, c++ );
    assert( c == nVars - sizeB );
}